

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::splatI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Literal *in_RDX;
  Literal *this_local;
  
  splat<(wasm::Type::BasicType)2,4>(__return_storage_ptr__,(wasm *)this,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::splatI32x4() const { return splat<Type::i32, 4>(*this); }